

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnrichableAnalyzerSubprocess.cpp
# Opt level: O1

void __thiscall EnrichableAnalyzerSubprocess::Start(EnrichableAnalyzerSubprocess *this)

{
  bool bVar1;
  int iVar2;
  __pid_t _Var3;
  int *piVar4;
  size_t sVar5;
  char *pcVar6;
  wordexp_t cmdParsed;
  char *args [25];
  wordexp_t local_100;
  char *local_e8 [26];
  
  if ((this->parserCommand)._M_string_length == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"No parser command defined; aborting subprocess.\n",0x30);
    Stop(this,1);
    this->enabled = false;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Starting analyzer subprocess: ",0x1e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,(this->parserCommand)._M_dataplus._M_p,
               (this->parserCommand)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
  }
  iVar2 = pipe(this->inpipefd);
  if (iVar2 < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Failed to create input pipe: ",0x1d);
    piVar4 = __errno_location();
    std::ostream::operator<<((ostream *)&std::cerr,*piVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
    Stop(this,1);
    this->enabled = false;
  }
  iVar2 = pipe(this->outpipefd);
  if (iVar2 < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Failed to create output pipe: ",0x1e);
    piVar4 = __errno_location();
    std::ostream::operator<<((ostream *)&std::cerr,*piVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
    Stop(this,1);
    this->enabled = false;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Starting fork...\n",0x11);
  _Var3 = fork();
  this->commandPid = _Var3;
  if (_Var3 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Forked...\n",10);
    iVar2 = dup2(this->outpipefd[0],0);
    if (iVar2 < 0) {
      pcVar6 = "Failed to redirect STDIN: ";
    }
    else {
      iVar2 = dup2(this->inpipefd[1],1);
      if (-1 < iVar2) {
        wordexp((this->parserCommand)._M_dataplus._M_p,&local_100,0);
        if (local_100.we_wordc == 0) {
          local_100.we_wordc = 0;
        }
        else {
          sVar5 = 0;
          do {
            local_e8[sVar5] = local_100.we_wordv[sVar5];
            sVar5 = sVar5 + 1;
          } while (local_100.we_wordc != sVar5);
        }
        local_e8[local_100.we_wordc] = (char *)0x0;
        close(this->inpipefd[0]);
        close(this->inpipefd[1]);
        close(this->outpipefd[0]);
        close(this->outpipefd[1]);
        execvp(local_e8[0],local_e8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Failed to spawn analyzer subprocess!\n",0x25);
        goto LAB_0010c95c;
      }
      pcVar6 = "Failed to redirect STDOUT: ";
    }
    std::operator<<((ostream *)&std::cerr,pcVar6);
    piVar4 = __errno_location();
    std::ostream::operator<<((ostream *)&std::cerr,*piVar4);
    std::operator<<((ostream *)&std::cerr,"\n");
    exit(*piVar4);
  }
  close(this->inpipefd[1]);
  close(this->outpipefd[0]);
LAB_0010c95c:
  bVar1 = GetFeatureEnablement(this,"bubble");
  this->featureBubble = bVar1;
  bVar1 = GetFeatureEnablement(this,"marker");
  this->featureMarker = bVar1;
  bVar1 = GetFeatureEnablement(this,"tabular");
  this->featureTabular = bVar1;
  return;
}

Assistant:

void EnrichableAnalyzerSubprocess::Start() {
	if(!parserCommand.length()) {
		std::cerr << "No parser command defined; aborting subprocess.\n";
		Terminate();
	} else {
		std::cerr << "Starting analyzer subprocess: ";
		std::cerr << parserCommand;
		std::cerr << "\n";
	}


	if(pipe(inpipefd) < 0) {
		std::cerr << "Failed to create input pipe: ";
		std::cerr << errno;
		std::cerr << "\n";
		Terminate();
	}
	if(pipe(outpipefd) < 0) {
		std::cerr << "Failed to create output pipe: ";
		std::cerr << errno;
		std::cerr << "\n";
		Terminate();
	}
	std::cerr << "Starting fork...\n";
	commandPid = fork();

	if(commandPid == 0) {
		std::cerr << "Forked...\n";
		if(dup2(outpipefd[0], STDIN_FILENO) < 0) {
			std::cerr << "Failed to redirect STDIN: ";
			std::cerr << errno;
			std::cerr << "\n";
			exit(errno);
		}
		if(dup2(inpipefd[1], STDOUT_FILENO) < 0) {
			std::cerr << "Failed to redirect STDOUT: ";
			std::cerr << errno;
			std::cerr << "\n";
			exit(errno);
		}

		wordexp_t cmdParsed;
		char *args[25];

		wordexp(parserCommand.c_str(), &cmdParsed, 0);
		int i;
		for(i = 0; i < cmdParsed.we_wordc; i++) {
			args[i] = cmdParsed.we_wordv[i];
		}
		args[i] = (char*)NULL;

		close(inpipefd[0]);
		close(inpipefd[1]);
		close(outpipefd[0]);
		close(outpipefd[1]);

		execvp(args[0], args);

		std::cerr << "Failed to spawn analyzer subprocess!\n";
	} else {
		close(inpipefd[1]);
		close(outpipefd[0]);
	}

	// Check script to see which features are enabled;
	// * 'no': This feature can be skipped.  This is used to improve
	//   performance by allowing the script to not receive messages for
	//   features it does not support.
	// * 'yes': Send messages of this type.
	// * Anything else: Send messages of this type.  This might be surprising,
	//   but it's more important to me that the default case be simple
	//   than the default case be high-performance.   Scripts are expected
	//   to respond to even unhandled messages.
	featureBubble = GetFeatureEnablement(BUBBLE_PREFIX);
	featureMarker = GetFeatureEnablement(MARKER_PREFIX);
	featureTabular = GetFeatureEnablement(TABULAR_PREFIX);
}